

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainInit.c
# Opt level: O0

void Abc_FrameEnd(Abc_Frame_t *pAbc)

{
  Abc_FrameInitializer_t *local_18;
  Abc_FrameInitializer_t *p;
  Abc_Frame_t *pAbc_local;
  
  for (local_18 = s_InitializerEnd; local_18 != (Abc_FrameInitializer_t *)0x0;
      local_18 = local_18->prev) {
    if (local_18->destroy != (Abc_Frame_Initialization_Func)0x0) {
      (*local_18->destroy)(pAbc);
    }
  }
  Abc_End(pAbc);
  Io_End(pAbc);
  Cmd_End(pAbc);
  If_End(pAbc);
  Map_End(pAbc);
  Mio_End(pAbc);
  Super_End(pAbc);
  Libs_End(pAbc);
  Load_End(pAbc);
  Scl_End(pAbc);
  Wlc_End(pAbc);
  Bac_End(pAbc);
  Cba_End(pAbc);
  Pla_End(pAbc);
  Sim_End(pAbc);
  Test_End(pAbc);
  Glucose_End(pAbc);
  return;
}

Assistant:

void Abc_FrameEnd( Abc_Frame_t * pAbc )
{
    Abc_FrameInitializer_t* p;
    for( p = s_InitializerEnd ; p ; p = p->prev )
        if ( p->destroy )
            p->destroy(pAbc);
    Abc_End( pAbc );
    Io_End( pAbc );
    Cmd_End( pAbc );
    If_End( pAbc );
    Map_End( pAbc );
    Mio_End( pAbc );
    Super_End( pAbc );
    Libs_End( pAbc );
    Load_End( pAbc );
    Scl_End( pAbc );
    Wlc_End( pAbc );
    Bac_End( pAbc );
    Cba_End( pAbc );
    Pla_End( pAbc );
    Sim_End( pAbc );
    Test_End( pAbc );
    Glucose_End( pAbc );
}